

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int main(int argc,char **argv)

{
  Node *node;
  int iVar1;
  int iVar2;
  GREG *G;
  Node **ppNVar3;
  char *pcVar4;
  long lVar5;
  
  output = _stdout;
  input = _stdin;
  lineNumber = 1;
  fileName = "<stdin>";
  do {
    while (iVar1 = getopt(argc,argv,"Vho:v"), iVar2 = _optind, iVar1 != 0x6f) {
      if (iVar1 != 0x76) {
        if (iVar1 != -1) {
          if (iVar1 == 0x68) {
            pcVar4 = __xpg_basename(*argv);
            version(pcVar4);
            fprintf(_stderr,"usage: %s [<option>...] [<file>...]\n",pcVar4);
            fwrite("where <option> can be\n",0x16,1,_stderr);
            fwrite("  -h          print this help information\n",0x2a,1,_stderr);
            fwrite("  -o <ofile>  write output to <ofile>\n",0x26,1,_stderr);
            fwrite("  -v          be verbose\n",0x19,1,_stderr);
            fwrite("  -V          print version number and exit\n",0x2c,1,_stderr);
            fwrite("if no <file> is given, input is read from stdin\n",0x30,1,_stderr);
            fwrite("if no <ofile> is given, output is written to stdout\n",0x34,1,_stderr);
          }
          else {
            if (iVar1 == 0x56) {
              pcVar4 = __xpg_basename(*argv);
              version(pcVar4);
              exit(0);
            }
            fprintf(_stderr,"for usage try: %s -h\n",*argv);
          }
          goto LAB_001029eb;
        }
        G = yyparse_new((void *)0x0);
        if (argc == iVar2) {
          iVar2 = yyparse(G);
          if (iVar2 == 0) goto LAB_001029f3;
          goto LAB_00102837;
        }
        lVar5 = 0;
        goto LAB_0010279f;
      }
      verboseFlag = verboseFlag + 1;
    }
    output = (FILE *)fopen(_optarg,"w");
    pcVar4 = _optarg;
  } while ((FILE *)output != (FILE *)0x0);
LAB_0010275f:
  perror(pcVar4);
LAB_001029eb:
  exit(1);
LAB_0010279f:
  if (argc - iVar2 == (int)lVar5) {
LAB_00102837:
    yyparse_free(G);
    if (verboseFlag != 0) {
      ppNVar3 = &rules;
      while (node = *ppNVar3, node != (Node *)0x0) {
        Rule_print(node);
        ppNVar3 = &(node->rule).next;
      }
    }
    Rule_compile_c_header();
    for (; headers != (Header *)0x0; headers = headers->next) {
      fprintf((FILE *)output,"%s\n",headers->text);
    }
    if (rules != (Node *)0x0) {
      Rule_compile_c(rules);
    }
    if (trailer != (char *)0x0) {
      fprintf((FILE *)output,"%s\n");
    }
    return 0;
  }
  pcVar4 = argv[iVar2 + lVar5];
  if ((*pcVar4 == '-') && (pcVar4[1] == '\0')) {
    input = _stdin;
    pcVar4 = "<stdin>";
  }
  else {
    input = (FILE *)fopen(pcVar4,"r");
    pcVar4 = argv[iVar2 + lVar5];
    if ((FILE *)input == (FILE *)0x0) goto LAB_0010275f;
  }
  lineNumber = 1;
  fileName = pcVar4;
  iVar1 = yyparse(G);
  if (iVar1 == 0) {
LAB_001029f3:
    yyerror(G,"syntax error");
    iVar2 = printf("%s version %d.%d.%d\n",G,0,4,4);
    return iVar2;
  }
  if (input != _stdin) {
    fclose((FILE *)input);
  }
  lVar5 = lVar5 + 1;
  goto LAB_0010279f;
}

Assistant:

int main(int argc, char **argv)
{
  GREG *G;
  Node *n;
  int   c;

  output= stdout;
  input= stdin;
  lineNumber= 1;
  fileName= "<stdin>";

  while (-1 != (c= getopt(argc, argv, "Vho:v")))
    {
      switch (c)
	{
	case 'V':
	  version(basename(argv[0]));
	  exit(0);

	case 'h':
	  usage(basename(argv[0]));
	  break;

	case 'o':
	  if (!(output= fopen(optarg, "w")))
	    {
	      perror(optarg);
	      exit(1);
	    }
	  break;

	case 'v':
	  verboseFlag++;
	  break;

	default:
	  fprintf(stderr, "for usage try: %s -h\n", argv[0]);
	  exit(1);
	}
    }
  argc -= optind;
  argv += optind;

  G = yyparse_new(NULL);
#ifdef YY_DEBUG
  if (verboseFlag > 0) {
    G->debug = DEBUG_PARSE;
    if (verboseFlag > 1)
      G->debug = DEBUG_PARSE + DEBUG_VERBOSE;
  }
#endif
  if (argc)
    {
      for (;  argc;  --argc, ++argv)
	{
	  if (!strcmp(*argv, "-"))
	    {
	      input= stdin;
	      fileName= "<stdin>";
	    }
	  else
	    {
	      if (!(input= fopen(*argv, "r")))
		{
		  perror(*argv);
		  exit(1);
		}
	      fileName= *argv;
	    }
	  lineNumber= 1;
	  if (!yyparse(G))
	    yyerror(G, "syntax error");
	  if (input != stdin)
	    fclose(input);
	}
    }
  else
    if (!yyparse(G))
      yyerror(G, "syntax error");
  yyparse_free(G);

  if (verboseFlag)
    for (n= rules;  n;  n= n->any.next)
      Rule_print(n);

  Rule_compile_c_header();

  for (; headers;  headers= headers->next)
    fprintf(output, "%s\n", headers->text);

  if (rules)
    Rule_compile_c(rules);

  if (trailer)
    fprintf(output, "%s\n", trailer);

  return 0;
}